

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
::destroy(btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
          *this,allocator_type *alloc)

{
  byte bVar1;
  undefined4 local_1c;
  int i;
  allocator_type *alloc_local;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
  *this_local;
  
  local_1c = 0;
  while( true ) {
    bVar1 = count(this);
    if ((int)(uint)bVar1 <= local_1c) break;
    value_destroy(this,(long)local_1c,alloc);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void destroy(allocator_type *alloc) {
            for (int i = 0; i < count(); ++i) {
                value_destroy(i, alloc);
            }
        }